

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderCheckMark(ImVec2 pos,ImU32 col,float sz)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *pIVar4;
  ImVec2 *pIVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImGuiContext *ctx;
  ImVec2 *pIVar8;
  int iVar9;
  int iVar10;
  float thickness;
  float fVar11;
  float fVar12;
  float fVar13;
  
  thickness = sz / 5.0;
  pIVar3 = GImGui->CurrentWindow;
  if (thickness <= 1.0) {
    thickness = 1.0;
  }
  fVar11 = sz - thickness * 0.5;
  fVar12 = fVar11 / 3.0;
  fVar13 = pos.x + thickness * 0.25 + fVar12;
  fVar11 = (pos.y + thickness * 0.25 + fVar11) - fVar12 * 0.5;
  pIVar4 = pIVar3->DrawList;
  iVar10 = (pIVar4->_Path).Size;
  iVar2 = (pIVar4->_Path).Capacity;
  if (iVar10 == iVar2) {
    iVar10 = iVar10 + 1;
    if (iVar2 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar2 / 2 + iVar2;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar2 < iVar10) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar8 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData);
      pIVar5 = (pIVar4->_Path).Data;
      if (pIVar5 != (ImVec2 *)0x0) {
        memcpy(pIVar8,pIVar5,(long)(pIVar4->_Path).Size << 3);
        pIVar5 = (pIVar4->_Path).Data;
        if ((pIVar5 != (ImVec2 *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar4->_Path).Data = pIVar8;
      (pIVar4->_Path).Capacity = iVar10;
    }
  }
  IVar7.y = fVar11 - fVar12;
  IVar7.x = fVar13 - fVar12;
  (pIVar4->_Path).Data[(pIVar4->_Path).Size] = IVar7;
  (pIVar4->_Path).Size = (pIVar4->_Path).Size + 1;
  pIVar4 = pIVar3->DrawList;
  iVar10 = (pIVar4->_Path).Size;
  iVar2 = (pIVar4->_Path).Capacity;
  if (iVar10 == iVar2) {
    iVar10 = iVar10 + 1;
    if (iVar2 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar2 / 2 + iVar2;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar2 < iVar10) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar8 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData);
      pIVar5 = (pIVar4->_Path).Data;
      if (pIVar5 != (ImVec2 *)0x0) {
        memcpy(pIVar8,pIVar5,(long)(pIVar4->_Path).Size << 3);
        pIVar5 = (pIVar4->_Path).Data;
        if ((pIVar5 != (ImVec2 *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar4->_Path).Data = pIVar8;
      (pIVar4->_Path).Capacity = iVar10;
    }
  }
  pIVar5 = (pIVar4->_Path).Data;
  iVar10 = (pIVar4->_Path).Size;
  pIVar5[iVar10].x = fVar13;
  pIVar5[iVar10].y = fVar11;
  (pIVar4->_Path).Size = (pIVar4->_Path).Size + 1;
  pIVar4 = pIVar3->DrawList;
  iVar10 = (pIVar4->_Path).Size;
  iVar2 = (pIVar4->_Path).Capacity;
  if (iVar10 == iVar2) {
    iVar10 = iVar10 + 1;
    if (iVar2 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar2 / 2 + iVar2;
    }
    if (iVar10 < iVar9) {
      iVar10 = iVar9;
    }
    if (iVar2 < iVar10) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar8 = (ImVec2 *)(*GImAllocatorAllocFunc)((long)iVar10 << 3,GImAllocatorUserData);
      pIVar5 = (pIVar4->_Path).Data;
      if (pIVar5 != (ImVec2 *)0x0) {
        memcpy(pIVar8,pIVar5,(long)(pIVar4->_Path).Size << 3);
        pIVar5 = (pIVar4->_Path).Data;
        if ((pIVar5 != (ImVec2 *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar4->_Path).Data = pIVar8;
      (pIVar4->_Path).Capacity = iVar10;
    }
  }
  IVar6.y = -fVar12 + -fVar12 + fVar11;
  IVar6.x = fVar12 + fVar12 + fVar13;
  (pIVar4->_Path).Data[(pIVar4->_Path).Size] = IVar6;
  (pIVar4->_Path).Size = (pIVar4->_Path).Size + 1;
  pIVar4 = pIVar3->DrawList;
  ImDrawList::AddPolyline(pIVar4,(pIVar4->_Path).Data,(pIVar4->_Path).Size,col,false,thickness);
  (pIVar4->_Path).Size = 0;
  return;
}

Assistant:

void ImGui::RenderCheckMark(ImVec2 pos, ImU32 col, float sz)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    float thickness = ImMax(sz / 5.0f, 1.0f);
    sz -= thickness*0.5f;
    pos += ImVec2(thickness*0.25f, thickness*0.25f);

    float third = sz / 3.0f;
    float bx = pos.x + third;
    float by = pos.y + sz - third*0.5f;
    window->DrawList->PathLineTo(ImVec2(bx - third, by - third));
    window->DrawList->PathLineTo(ImVec2(bx, by));
    window->DrawList->PathLineTo(ImVec2(bx + third*2, by - third*2));
    window->DrawList->PathStroke(col, false, thickness);
}